

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMemPool.c
# Opt level: O0

deMemPool * deMemPool_createRoot(deMemPoolUtil *util,deUint32 flags)

{
  deMemPoolUtil *pdVar1;
  deMemPoolUtil *utilCopy;
  deMemPool *pool;
  deUint32 flags_local;
  deMemPoolUtil *util_local;
  
  util_local = (deMemPoolUtil *)createPoolInternal((deMemPool *)0x0);
  if ((deMemPool *)util_local == (deMemPool *)0x0) {
    util_local = (deMemPoolUtil *)0x0;
  }
  else if (util != (deMemPoolUtil *)0x0) {
    pdVar1 = (deMemPoolUtil *)deMemPool_alloc((deMemPool *)util_local,0x10);
    if (pdVar1 == (deMemPoolUtil *)0x0) {
      deMemPool_destroy((deMemPool *)util_local);
      util_local = (deMemPoolUtil *)0x0;
    }
    else {
      pdVar1->userPointer = util->userPointer;
      pdVar1->allocFailCallback = util->allocFailCallback;
      ((deMemPool *)util_local)->util = pdVar1;
    }
  }
  return (deMemPool *)util_local;
}

Assistant:

deMemPool* deMemPool_createRoot	(const deMemPoolUtil* util, deUint32 flags)
{
	deMemPool* pool = createPoolInternal(DE_NULL);
	if (!pool)
		return DE_NULL;
#if defined(DE_SUPPORT_FAILING_POOL_ALLOC)
	if (flags & DE_MEMPOOL_ENABLE_FAILING_ALLOCS)
		pool->allowFailing = DE_TRUE;
#endif
#if defined(DE_SUPPORT_DEBUG_POOLS)
	if (flags & DE_MEMPOOL_ENABLE_DEBUG_ALLOCS)
	{
		pool->enableDebugAllocs		= DE_TRUE;
		pool->debugAllocListHead	= DE_NULL;
	}
#endif
	DE_UNREF(flags); /* in case no debug features enabled */

	/* Get copy of utilities. */
	if (util)
	{
		deMemPoolUtil* utilCopy = DE_POOL_NEW(pool, deMemPoolUtil);
		DE_ASSERT(util->allocFailCallback);
		if (!utilCopy)
		{
			deMemPool_destroy(pool);
			return DE_NULL;
		}

		memcpy(utilCopy, util, sizeof(deMemPoolUtil));
		pool->util = utilCopy;
	}

	return pool;
}